

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testIoPerformance(void)

{
  size_t size;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  uint64_t uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  void *src;
  void *dst;
  ssize_t sVar14;
  char *pcVar15;
  ulong uVar16;
  ulong count;
  File simpleFileDst;
  File simpleFileSrc;
  RecordFileHdr hdr;
  Record rec;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  MappedFile mappedFileSrc;
  MappedFile mappedFileDst;
  File local_260;
  File local_25c;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_258;
  uint64_t local_220;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_218;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_1f8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_1d8;
  Time local_1ac;
  undefined1 local_198 [184];
  MappedFile local_e0;
  
  local_25c.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_260.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_198[0x10] = 0;
  local_198._17_7_ = 0;
  local_198[0x18] = false;
  local_198._0_8_ = (C *)0x0;
  local_198[8] = 0;
  local_198._9_7_ = 0;
  sVar10 = strlen(testIoPerformance::fileNameSrc);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)local_198,(BufHdr *)0x0);
  local_198._0_8_ = testIoPerformance::fileNameSrc;
  local_198[0x10] = (undefined1)sVar10;
  local_198._17_7_ = (undefined7)(sVar10 >> 8);
  local_198[0x18] = true;
  iVar9 = axl::io::File::open(&local_25c,local_198,1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)local_198);
  if ((char)iVar9 == '\0') {
    axl::err::getLastErrorDescription();
    pcVar15 = (char *)local_198._0_8_;
    if (CONCAT71(local_198._17_7_,local_198[0x10]) == 0) {
      pcVar15 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    printf("can\'t open %s: %s\n",testIoPerformance::fileNameSrc,pcVar15);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)local_198);
    goto LAB_00112ab0;
  }
  local_1f8.m_p = (char *)0x0;
  local_1f8.m_hdr = (Hdr *)0x0;
  local_1f8.m_count = 0;
  axl::io::MappedFile::MappedFile((MappedFile *)local_198);
  axl::io::MappedFile::MappedFile(&local_e0);
  local_258.m_length._0_1_ = 0;
  local_258.m_length._1_7_ = 0;
  local_258.m_isNullTerminated = false;
  local_258.m_p = (C *)0x0;
  local_258.m_hdr._0_1_ = 0;
  local_258.m_hdr._1_7_ = 0;
  sVar10 = strlen(testIoPerformance::fileNameSrc);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_258,(BufHdr *)0x0);
  local_258.m_p = testIoPerformance::fileNameSrc;
  local_258.m_length._0_1_ = (undefined1)sVar10;
  local_258.m_length._1_7_ = (undefined7)(sVar10 >> 8);
  local_258.m_isNullTerminated = true;
  iVar9 = axl::io::MappedFile::open((MappedFile *)local_198,(char *)&local_258,1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
  if ((char)iVar9 == '\0') {
LAB_00112a54:
    axl::err::getLastErrorDescription();
    pcVar15 = local_258.m_p;
    if (CONCAT71(local_258.m_length._1_7_,(undefined1)local_258.m_length) == 0) {
      pcVar15 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    printf("error: %s\n",pcVar15);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
  }
  else {
    local_258.m_length._0_1_ = 0;
    local_258.m_length._1_7_ = 0;
    local_258.m_isNullTerminated = false;
    local_258.m_p = (C *)0x0;
    local_258.m_hdr._0_1_ = 0;
    local_258.m_hdr._1_7_ = 0;
    sVar10 = strlen(testIoPerformance::fileNameDst_m);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_258,(BufHdr *)0x0);
    local_258.m_p = testIoPerformance::fileNameDst_m;
    local_258.m_length._0_1_ = (undefined1)sVar10;
    local_258.m_length._1_7_ = (undefined7)(sVar10 >> 8);
    local_258.m_isNullTerminated = true;
    iVar9 = axl::io::MappedFile::open(&local_e0,(char *)&local_258,0);
    if ((char)iVar9 == '\0') {
      bVar8 = false;
    }
    else {
      bVar8 = axl::io::MappedFile::setSize(&local_e0,0);
    }
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
    if (bVar8 == false) goto LAB_00112a54;
    puts("testing mapped file...");
    uVar11 = axl::sys::getTimestamp();
    puVar12 = (undefined8 *)
              axl::io::MappedFile::view((MappedFile *)local_198,0,0x30,(size_t *)0x0,true);
    local_220 = uVar11;
    puVar13 = (undefined8 *)axl::io::MappedFile::view(&local_e0,0,0x30,(size_t *)0x0,true);
    uVar2 = *puVar12;
    uVar3 = puVar12[1];
    uVar4 = puVar12[2];
    uVar5 = puVar12[3];
    uVar6 = puVar12[5];
    puVar13[4] = puVar12[4];
    puVar13[5] = uVar6;
    puVar13[2] = uVar4;
    puVar13[3] = uVar5;
    *puVar13 = uVar2;
    puVar13[1] = uVar3;
    lVar1 = puVar12[2];
    if (0x30 < lVar1 + 0x30U) {
      uVar11 = 0x30;
      do {
        src = axl::io::MappedFile::view((MappedFile *)local_198,uVar11,0x18,(size_t *)0x0,false);
        size = (ulong)*(uint *)((long)src + 0x10) + 0x18;
        if ((ulong)*(uint *)((long)src + 0x10) != 0) {
          src = axl::io::MappedFile::view((MappedFile *)local_198,uVar11,size,(size_t *)0x0,false);
        }
        dst = axl::io::MappedFile::view(&local_e0,uVar11,size,(size_t *)0x0,false);
        __wrap_memcpy(dst,src,size);
        uVar11 = uVar11 + size;
      } while (uVar11 < lVar1 + 0x30U);
    }
    uVar11 = axl::sys::getTimestamp();
    axl::sys::Time::setTimestampImpl((Time *)&local_1d8,uVar11 - local_220,false,0);
    local_218.m_length._0_4_ = 0;
    local_218.m_length._4_4_ = 0;
    local_218.m_isNullTerminated = false;
    local_218.m_p = (C *)0x0;
    local_218.m_hdr._0_1_ = 0;
    local_218.m_hdr._1_7_ = 0;
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_218,(BufHdr *)0x0);
    local_218.m_p = "%m.%s.%l";
    local_218.m_length._0_4_ = 8;
    local_218.m_length._4_4_ = 0;
    local_218.m_isNullTerminated = true;
    axl::sys::Time::format((String *)&local_258,(Time *)&local_1d8,&local_218);
    printf("Done: %s\n");
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_218);
    local_258.m_length._0_1_ = 0;
    local_258.m_length._1_7_ = 0;
    local_258.m_isNullTerminated = false;
    local_258.m_p = (C *)0x0;
    local_258.m_hdr._0_1_ = 0;
    local_258.m_hdr._1_7_ = 0;
    sVar10 = strlen(testIoPerformance::fileNameDst_s);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_258,(BufHdr *)0x0);
    local_258.m_p = testIoPerformance::fileNameDst_s;
    local_258.m_length._0_1_ = (undefined1)sVar10;
    local_258.m_length._1_7_ = (undefined7)(sVar10 >> 8);
    local_258.m_isNullTerminated = true;
    iVar9 = axl::io::File::open(&local_260,(char *)&local_258,0);
    if ((char)iVar9 == '\0') {
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
LAB_00112d04:
      axl::err::getLastErrorDescription();
      pcVar15 = local_258.m_p;
      if (CONCAT71(local_258.m_length._1_7_,(undefined1)local_258.m_length) == 0) {
        pcVar15 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      printf("error: %s\n",pcVar15);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
    }
    else {
      iVar9 = ftruncate64((int)local_260.m_file.
                               super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                               m_h,0);
      if (iVar9 == -1) {
        axl::err::setLastSystemError();
      }
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_258);
      if (iVar9 == -1) goto LAB_00112d04;
      puts("testing simple file...");
      local_220 = axl::sys::getTimestamp();
      sVar14 = read((int)local_25c.m_file.
                         super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                    &local_258,0x30);
      if (sVar14 == -1) {
        axl::err::setLastSystemError();
      }
      sVar14 = write((int)local_260.m_file.
                          super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                     &local_258,0x30);
      if (sVar14 == -1) {
        axl::err::setLastSystemError();
      }
      uVar7 = CONCAT71(local_258.m_length._1_7_,(undefined1)local_258.m_length);
      if (uVar7 != 0) {
        uVar16 = 0;
        do {
          sVar14 = read((int)local_25c.m_file.
                             super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h
                        ,&local_218,0x18);
          if (sVar14 == -1) {
            axl::err::setLastSystemError();
          }
          count = (ulong)(uint)local_218.m_length;
          if (count != 0) {
            axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
            setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
                      ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_1f8,count);
            bVar8 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive
                              ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_1f8);
            pcVar15 = local_1f8.m_p;
            if (!bVar8) {
              pcVar15 = (char *)0x0;
            }
            sVar14 = read((int)local_25c.m_file.
                               super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                               m_h,pcVar15,count);
            if (sVar14 == -1) {
              axl::err::setLastSystemError();
            }
          }
          sVar14 = write((int)local_260.m_file.
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                              m_h,&local_218,0x18);
          if (sVar14 == -1) {
            axl::err::setLastSystemError();
          }
          sVar14 = write((int)local_260.m_file.
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                              m_h,local_1f8.m_p,count);
          if (sVar14 == -1) {
            axl::err::setLastSystemError();
          }
          uVar16 = uVar16 + count + 0x18;
        } while (uVar16 < uVar7);
      }
      uVar11 = axl::sys::getTimestamp();
      axl::sys::Time::setTimestampImpl(&local_1ac,uVar11 - local_220,false,0);
      local_1d8.m_length._0_1_ = 0;
      local_1d8.m_length._1_7_ = 0;
      local_1d8.m_isNullTerminated = false;
      local_1d8.m_p = (C *)0x0;
      local_1d8.m_hdr._0_1_ = 0;
      local_1d8.m_hdr._1_7_ = 0;
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                (&local_1d8,(BufHdr *)0x0);
      local_1d8.m_p = "%m.%s.%l";
      local_1d8.m_length._0_1_ = 8;
      local_1d8.m_length._1_7_ = 0;
      local_1d8.m_isNullTerminated = true;
      axl::sys::Time::format((String *)&local_218,&local_1ac,&local_1d8);
      pcVar15 = local_218.m_p;
      if (CONCAT44(local_218.m_length._4_4_,(uint)local_218.m_length) == 0) {
        pcVar15 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      printf("Done: %s\n",pcVar15);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_218);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_1d8);
    }
  }
  axl::io::MappedFile::~MappedFile(&local_e0);
  axl::io::MappedFile::~MappedFile((MappedFile *)local_198);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_1f8);
LAB_00112ab0:
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_260);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_25c);
  return;
}

Assistant:

void
testIoPerformance() {
	#define _READ_ONLY 0
	#define _DUMMY_WRITE 0

	io::File simpleFileSrc;
#if (!_READ_ONLY)
	io::File simpleFileDst;
#endif

	static char fileNameSrc[] = "G:/Temp/Test MTK TCP/Test MTK TCP.njlog";
	static char fileNameDst_s[] = "G:/Temp/Test MTK TCP/Test MTK TCP - 2.njlog";
	static char fileNameDst_m[] = "G:/Temp/Test MTK TCP/Test MTK TCP - 3.njlog";

	bool result = simpleFileSrc.open(fileNameSrc, io::FileFlag_ReadOnly);
	if (!result) {
		printf("can't open %s: %s\n", fileNameSrc, err::getLastErrorDescription().sz());
		return;
	}

	uint64_t baseTimestamp;
	uint64_t time;
	uint64_t offset;

	sl::Array<char> buffer;

	struct Rec: Record {
		char m_data[1024];
	};

	Rec staticRec;
	memset(&staticRec, 0, sizeof(staticRec));
	staticRec.m_dataSize = sizeof(staticRec.m_data);

	io::MappedFile mappedFileSrc;
	io::MappedFile mappedFileDst;

	result = mappedFileSrc.open(fileNameSrc, io::FileFlag_ReadOnly);

#if (!_READ_ONLY)
	result =
		result &&
		mappedFileDst.open(fileNameDst_m) &&
		mappedFileDst.setSize(0);
#endif

	if (!result) {
		printf("error: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("testing mapped file...\n");
	baseTimestamp = sys::getTimestamp();

	RecordFileHdr* hdr2 = (RecordFileHdr*)mappedFileSrc.view(0, sizeof(RecordFileHdr), true);

#if (!_READ_ONLY)
	RecordFileHdr* hdr3 = (RecordFileHdr*)mappedFileDst.view(0, sizeof(RecordFileHdr), true);
	*hdr3 = *hdr2;
#endif

	offset = sizeof(RecordFileHdr);
	uint64_t endOffset = offset + hdr2->m_totalRecordSize;

	while (offset < endOffset) {
#if (_DUMMY_WRITE)
		Record* rec = &staticRec;
		size_t recSize = sizeof(rec);
#else
		Record* rec = (Record*)mappedFileSrc.view(offset, sizeof(Record));
		size_t recSize = sizeof(Record) + rec->m_dataSize;
		if (rec->m_dataSize)
			rec = (Record*)mappedFileSrc.view(offset, recSize);
#endif

#if (!_READ_ONLY)
		void* p = mappedFileDst.view(offset, recSize);
		memcpy(p, rec, recSize);
#endif

		offset += recSize;
	}

	time = sys::getTimestamp() - baseTimestamp;
	printf("Done: %s\n", sys::Time(time, 0).format("%m.%s.%l").sz());

#if (!_READ_ONLY)
	result =
		result	&&
		simpleFileDst.open(fileNameDst_s) &&
		simpleFileDst.setSize(0);
#endif

	if (!result) {
		printf("error: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("testing simple file...\n");
	baseTimestamp = sys::getTimestamp();

	RecordFileHdr hdr;
	simpleFileSrc.read(&hdr, sizeof(hdr));

#if (!_READ_ONLY)
	simpleFileDst.write(&hdr, sizeof(hdr));
#endif

	offset = 0;
	while (offset < hdr.m_totalRecordSize) {
#if (!_DUMMY_WRITE)
		Record rec;
		simpleFileSrc.read(&rec, sizeof(rec));
		if (rec.m_dataSize) {
			buffer.setCount(rec.m_dataSize);
			simpleFileSrc.read(buffer.p(), rec.m_dataSize);
		}

#	if (!_READ_ONLY)
		simpleFileDst.write(&rec, sizeof(rec));
		simpleFileDst.write(buffer, rec.m_dataSize);
#	endif

		offset += sizeof(rec) + rec.m_dataSize;
#else
		simpleFileDst.write(&staticRec, sizeof(staticRec));
		offset += sizeof(staticRec);
#endif
	}

	time = sys::getTimestamp() - baseTimestamp;
	printf("Done: %s\n", sys::Time(time, 0).format("%m.%s.%l").sz());
}